

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.cpp
# Opt level: O3

void __thiscall
duckdb::CSVSchema::CSVSchema
          (CSVSchema *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types,string *file_path,idx_t rows_read_p,
          bool empty_p)

{
  (this->columns).super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name_idx_map)._M_h._M_buckets = &(this->name_idx_map)._M_h._M_single_bucket;
  (this->name_idx_map)._M_h._M_bucket_count = 1;
  (this->name_idx_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->name_idx_map)._M_h._M_element_count = 0;
  (this->name_idx_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->name_idx_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->name_idx_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->file_path)._M_dataplus._M_p = (pointer)&(this->file_path).field_2;
  (this->file_path)._M_string_length = 0;
  (this->file_path).field_2._M_local_buf[0] = '\0';
  this->rows_read = rows_read_p;
  this->empty = empty_p;
  Initialize(this,names,types,file_path);
  return;
}

Assistant:

CSVSchema::CSVSchema(const vector<string> &names, const vector<LogicalType> &types, const string &file_path,
                     idx_t rows_read_p, const bool empty_p)
    : rows_read(rows_read_p), empty(empty_p) {
	Initialize(names, types, file_path);
}